

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper<int,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase1
               (unsigned_long lhs,
               SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  bool bVar1;
  int iVar2;
  undefined4 *in_RDX;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  unsigned_long *in_stack_ffffffffffffffb8;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_ffffffffffffffc0;
  undefined4 local_30;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar2 = ::SafeInt::operator_cast_to_int(in_stack_ffffffffffffffc0);
  if (iVar2 < 1) {
    iVar2 = ::SafeInt::operator_cast_to_int(in_stack_ffffffffffffffc0);
    if (iVar2 == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    bVar1 = DivisionNegativeCornerCaseHelper<int,_unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
            ::NegativeCornerCase
                      ((unsigned_long)in_RDX,
                       (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       (int)in_RDI,
                       (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (!bVar1) {
      ::SafeInt::operator_cast_to_int(in_stack_ffffffffffffffc0);
      SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_long>
                (in_stack_ffffffffffffffc0,(unsigned_long *)in_RDI);
      *in_RDX = local_30;
    }
  }
  else {
    ::SafeInt::operator_cast_to_int(in_RDI);
    SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_long>
              (in_RDI,in_stack_ffffffffffffffb8);
    *in_RDX = in_stack_ffffffffffffffe4;
  }
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }